

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanLogicalDevice.cpp
# Opt level: O0

void __thiscall
VulkanUtilities::VulkanLogicalDevice::~VulkanLogicalDevice(VulkanLogicalDevice *this)

{
  VulkanLogicalDevice *this_local;
  
  (*vkDestroyDevice)(this->m_VkDevice,this->m_VkAllocator);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&this->m_SupportedAccessMask);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&this->m_SupportedStagesMask);
  std::enable_shared_from_this<VulkanUtilities::VulkanLogicalDevice>::~enable_shared_from_this
            (&this->super_enable_shared_from_this<VulkanUtilities::VulkanLogicalDevice>);
  return;
}

Assistant:

VulkanLogicalDevice::~VulkanLogicalDevice()
{
    vkDestroyDevice(m_VkDevice, m_VkAllocator);
}